

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICommand.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_1c0e836::processObjectKindVersions
          (string *__return_storage_ptr__,anon_unknown_dwarf_1c0e836 *this,cmFileAPI *fileApi,
          ObjectKind objectKind,string_view keyword,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *versions)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *__nptr;
  bool bVar2;
  uint majorVersion;
  uint minorVersion;
  long lVar3;
  undefined4 in_register_0000000c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  string_view keyword_local;
  
  keyword_local._M_len = CONCAT44(in_register_0000000c,objectKind);
  keyword_local._M_str = (char *)keyword._M_len;
  b = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)keyword._M_str;
  pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            ((long)keyword._M_str + 8);
  if (b == pbVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    for (; b != pbVar1; b = b + 1) {
      __nptr = (b->_M_dataplus)._M_p;
      majorVersion = atoi(__nptr);
      minorVersion = 0;
      lVar3 = std::__cxx11::string::find((char)b,0x2e);
      if (lVar3 != -1) {
        minorVersion = atoi(__nptr + lVar3 + 1);
      }
      if (((int)majorVersion < 1) || ((int)minorVersion < 0)) {
        cmStrCat<char_const(&)[28],std::__cxx11::string_const&,char_const(&)[7],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[2]>
                  (__return_storage_ptr__,(char (*) [28])"Given a malformed version \"",b,
                   (char (*) [7])"\" for ",&keyword_local,(char (*) [2])0x793a2d);
        return __return_storage_ptr__;
      }
      bVar2 = cmFileAPI::AddProjectQuery
                        ((cmFileAPI *)this,(ObjectKind)fileApi,majorVersion,minorVersion);
      if (bVar2) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        return __return_storage_ptr__;
      }
    }
    cmStrCat<char_const(&)[23],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[49]>
              (__return_storage_ptr__,(char (*) [23])"None of the specified ",&keyword_local,
               (char (*) [49])" versions is supported by this version of CMake.");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string processObjectKindVersions(cmFileAPI& fileApi,
                                      cmFileAPI::ObjectKind objectKind,
                                      cm::string_view keyword,
                                      const std::vector<std::string>& versions)
{
  // The "versions" vector is empty only when the keyword was not present.
  // It is an error to provide the keyword with no versions after it, and that
  // is enforced by the argument parser before we get here.
  if (versions.empty()) {
    return {};
  }

  // The first supported version listed is what we use
  for (const std::string& ver : versions) {
    const char* vStart = ver.c_str();
    int majorVersion = std::atoi(vStart);
    int minorVersion = 0;
    std::string::size_type pos = ver.find('.');
    if (pos != std::string::npos) {
      vStart += pos + 1;
      minorVersion = std::atoi(vStart);
    }
    if (majorVersion < 1 || minorVersion < 0) {
      return cmStrCat("Given a malformed version \"", ver, "\" for ", keyword,
                      ".");
    }
    if (fileApi.AddProjectQuery(objectKind,
                                static_cast<unsigned>(majorVersion),
                                static_cast<unsigned>(minorVersion))) {
      return {};
    }
  }
  return cmStrCat("None of the specified ", keyword,
                  " versions is supported by this version of CMake.");
}